

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusWindow(ImGuiWindow_conflict *window)

{
  ImGuiTabBar *pIVar1;
  ImGuiContext_conflict1 *pIVar2;
  ImGuiWindow_conflict *pIVar3;
  ImGuiID IVar4;
  ImGuiContext_conflict1 *g;
  ImGuiDockNode *pIVar5;
  ImGuiWindow_conflict *window_00;
  ImGuiWindow_conflict *window_01;
  bool bVar6;
  bool bVar7;
  
  pIVar2 = GImGui;
  if (GImGui->NavWindow != window) {
    GImGui->NavWindow = window;
    IVar4 = 0;
    if (window != (ImGuiWindow_conflict *)0x0) {
      if (pIVar2->NavDisableMouseHover == true) {
        pIVar2->NavMousePosDirty = true;
      }
      IVar4 = window->NavLastIds[0];
    }
    pIVar2->NavId = IVar4;
    pIVar2->NavFocusScopeId = 0;
    pIVar2->NavIdIsAlive = false;
    pIVar2->NavLayer = ImGuiNavLayer_Main;
    pIVar2->NavMoveSubmitted = false;
    pIVar2->NavMoveScoringItems = false;
    pIVar2->NavAnyRequest = false;
    pIVar2->NavInitRequest = false;
  }
  ClosePopupsOverWindow(window,false);
  if (window == (ImGuiWindow_conflict *)0x0) {
    pIVar3 = pIVar2->ActiveIdWindow;
    bVar6 = false;
    pIVar5 = (ImGuiDockNode *)0x0;
    window_01 = (ImGuiWindow_conflict *)0x0;
    window_00 = (ImGuiWindow_conflict *)0x0;
  }
  else {
    window_00 = window->RootWindowDockTree;
    if (window_00 == (ImGuiWindow_conflict *)0x0) {
      __assert_fail("window == __null || window->RootWindowDockTree != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x1b94,"void ImGui::FocusWindow(ImGuiWindow *)");
    }
    window_01 = window->RootWindow;
    pIVar5 = window->DockNode;
    pIVar3 = pIVar2->ActiveIdWindow;
    bVar6 = pIVar5 != (ImGuiDockNode *)0x0;
    if (pIVar3 != (ImGuiWindow_conflict *)0x0 && bVar6) {
      bVar7 = pIVar5->HostWindow == pIVar3;
      bVar6 = true;
      goto LAB_00184d07;
    }
  }
  bVar7 = false;
LAB_00184d07:
  if (((pIVar3 != (ImGuiWindow_conflict *)0x0 && pIVar2->ActiveId != 0) &&
      (pIVar3->RootWindow != window_01)) &&
     (!bVar7 && (pIVar2->ActiveIdNoClearOnFocusLoss & 1U) == 0)) {
    SetActiveID(0,(ImGuiWindow_conflict *)0x0);
  }
  if (window != (ImGuiWindow_conflict *)0x0) {
    window->LastFrameJustFocused = pIVar2->FrameCount;
    if ((bVar6) && (pIVar1 = pIVar5->TabBar, pIVar1 != (ImGuiTabBar *)0x0)) {
      IVar4 = window->ID;
      pIVar1->NextSelectedTabId = IVar4;
      pIVar1->SelectedTabId = IVar4;
    }
    BringWindowToFocusFront(window_01);
    if (((uint)(window_01->Flags | window->Flags | window_00->Flags) >> 0xd & 1) == 0) {
      BringWindowToDisplayFront(window_00);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavFocusScopeId = 0;
        g.NavIdIsAlive = false;
        g.NavLayer = ImGuiNavLayer_Main;
        g.NavInitRequest = g.NavMoveSubmitted = g.NavMoveScoringItems = false;
        NavUpdateAnyRequestFlag();
        //IMGUI_DEBUG_LOG("FocusWindow(\"%s\")\n", window ? window->Name : NULL);
    }

    // Close popups if any
    ClosePopupsOverWindow(window, false);

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindowDockTree != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL;
    ImGuiWindow* display_front_window = window ? window->RootWindowDockTree : NULL;
    ImGuiDockNode* dock_node = window ? window->DockNode : NULL;
    bool active_id_window_is_dock_node_host = (g.ActiveIdWindow && dock_node && dock_node->HostWindow == g.ActiveIdWindow);

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    // - Using dock host items (tab, collapse button) can trigger this before we redirect the ActiveIdWindow toward the child window.
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss && !active_id_window_is_dock_node_host)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;
    window->LastFrameJustFocused = g.FrameCount;

    // Select in dock node
    if (dock_node && dock_node->TabBar)
        dock_node->TabBar->SelectedTabId = dock_node->TabBar->NextSelectedTabId = window->ID;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | focus_front_window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}